

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_136b449::HandleArchiveCreateCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *format;
  _Alloc_hider __nptr;
  bool bVar1;
  bool bVar2;
  int iVar3;
  char **ppcVar4;
  Arguments *pAVar5;
  iterator iVar6;
  int *piVar7;
  long lVar8;
  offset_in_Arguments_to_MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  member;
  _Rb_tree_color compressType;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>
  __l;
  cmTarCompression local_298;
  allocator_type local_292;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_291;
  int minCompressionLevel;
  undefined4 uStack_28c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  int local_26c;
  char *knownFormats [6];
  char *local_238;
  undefined1 local_230 [32];
  pointer local_210;
  undefined1 auStack_208 [16];
  undefined1 auStack_1f8 [24];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_1b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_190;
  cmTarCompression local_164 [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrecognizedArguments;
  char *zipFileFormats [2];
  Arguments parsedArgs;
  
  if (((anonymous_namespace)::
       HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar3 != 0)) {
    parsedArgs.Format.field_2._M_allocated_capacity = 0;
    parsedArgs.Format.field_2._8_8_ = 0;
    parsedArgs.Format._M_dataplus._M_p = (pointer)0x0;
    parsedArgs.Format._M_string_length = 0;
    parsedArgs.Output.field_2._M_allocated_capacity = 0;
    parsedArgs.Output.field_2._8_8_ = 0;
    parsedArgs.Output._M_dataplus._M_p = (pointer)0x0;
    parsedArgs.Output._M_string_length = 0;
    parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_right
         = (_Base_ptr)0x0;
    parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)0x0;
    parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left
         = (_Base_ptr)0x0;
    parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ = 0;
    parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_color
         = _S_red;
    parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
         0;
    name.super_string_view._M_str = "OUTPUT";
    name.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parsedArgs,name,0x30);
    name_00.super_string_view._M_str = "FORMAT";
    name_00.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parsedArgs,name_00,0x50);
    name_01.super_string_view._M_str = "COMPRESSION";
    name_01.super_string_view._M_len = 0xb;
    cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parsedArgs,name_01,0x70);
    member = 0x90;
    name_02.super_string_view._M_str = "COMPRESSION_LEVEL";
    name_02.super_string_view._M_len = 0x11;
    cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parsedArgs,name_02,0x90);
    name_03.super_string_view._M_str = "MTIME";
    name_03.super_string_view._M_len = 5;
    cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<ArgumentParser::Maybe<std::__cxx11::string>>
              ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parsedArgs,name_03,member);
    name_04.super_string_view._M_str = "VERBOSE";
    name_04.super_string_view._M_len = 7;
    cmArgumentParser<Arguments>::Bind<bool>
              ((cmArgumentParser<Arguments> *)&parsedArgs,name_04,member);
    name_05.super_string_view._M_str = "PATHS";
    name_05.super_string_view._M_len = 5;
    cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parsedArgs,name_05,member);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&HandleArchiveCreateCommand::parser,(ActionMap *)&parsedArgs);
    ArgumentParser::Base::~Base((Base *)&parsedArgs);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleArchiveCreateCommand::parser,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  local_230._16_8_ = &unrecognizedArguments;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  knownFormats[1] =
       (char *)(args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
  knownFormats[0] =
       (char *)((args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 1);
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
       & 0xffffffff00000000;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parsedArgs.Output._M_dataplus._M_p = (pointer)&parsedArgs.Output.field_2;
  parsedArgs.Output._M_string_length = 0;
  parsedArgs.Output.field_2._M_allocated_capacity =
       parsedArgs.Output.field_2._M_allocated_capacity & 0xffffffffffffff00;
  parsedArgs.Format._M_dataplus._M_p = (pointer)&parsedArgs.Format.field_2;
  parsedArgs.Format._M_string_length = 0;
  parsedArgs.Format.field_2._M_allocated_capacity =
       parsedArgs.Format.field_2._M_allocated_capacity & 0xffffffffffffff00;
  parsedArgs.Compression._M_dataplus._M_p = (pointer)&parsedArgs.Compression.field_2;
  parsedArgs.Compression._M_string_length = 0;
  parsedArgs.Compression.field_2._M_local_buf[0] = '\0';
  parsedArgs.CompressionLevel._M_dataplus._M_p = (pointer)&parsedArgs.CompressionLevel.field_2;
  parsedArgs.CompressionLevel._M_string_length = 0;
  parsedArgs.CompressionLevel.field_2._M_local_buf[0] = '\0';
  parsedArgs.MTime.super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>.
  _M_dataplus._M_p =
       (pointer)&parsedArgs.MTime.
                 super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>.field_2;
  parsedArgs.MTime.super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>.
  _M_string_length = 0;
  parsedArgs.MTime.super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>.field_2.
  _M_local_buf[0] = '\0';
  parsedArgs.Verbose = false;
  parsedArgs.Paths.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parsedArgs.Paths.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parsedArgs.Paths.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_230._0_8_ = &HandleArchiveCreateCommand::parser;
  local_230._8_8_ = &parsedArgs;
  local_210 = (pointer)0x0;
  auStack_208._0_8_ = (char *)0x0;
  auStack_208._8_8_ = 0;
  auStack_1f8._0_8_ = (char *)0x0;
  auStack_1f8._8_8_ = (void *)0x0;
  auStack_1f8._16_8_ = 0;
  local_1e0.first._M_dataplus._M_p = (pointer)0x0;
  local_1e0.first._M_string_length = 0;
  local_1e0.first.field_2._M_local_buf[0] = false;
  local_230._24_8_ = local_230._8_8_;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_230,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)knownFormats,0);
  if ((_Manager_type)local_1e0.first._M_dataplus._M_p != (_Manager_type)0x0) {
    (*(code *)local_1e0.first._M_dataplus._M_p)(auStack_1f8 + 8,auStack_1f8 + 8,3);
  }
  if (unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = ArgumentParser::ParseResult::MaybeReportError
                      (&parsedArgs.super_ParseResult,status->Makefile);
    if (bVar1) {
      cmSystemTools::s_FatalErrorOccurred = true;
      bVar1 = true;
      goto LAB_003cc23e;
    }
    format = &parsedArgs.Format;
    knownFormats[4] = "raw";
    knownFormats[5] = "zip";
    knownFormats[2] = "pax";
    knownFormats[3] = "paxr";
    knownFormats[0] = "7zip";
    knownFormats[1] = "gnutar";
    if ((parsedArgs.Format._M_string_length == 0) ||
       (ppcVar4 = std::
                  __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            (knownFormats,&local_238,format), ppcVar4 != &local_238)) {
      zipFileFormats[0]._0_4_ = 0x91435d;
      zipFileFormats[0]._4_4_ = 0;
      zipFileFormats[1]._0_4_ = 0x91435e;
      zipFileFormats[1]._4_4_ = 0;
      if ((parsedArgs.Compression._M_string_length == 0) ||
         (pAVar5 = (Arguments *)
                   std::
                   __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                             (zipFileFormats,&parsedArgs,format), pAVar5 == &parsedArgs)) {
        if (((anonymous_namespace)::
             HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
             ::compressionTypeMap_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                         HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                         ::compressionTypeMap_abi_cxx11_), iVar3 != 0)) {
          minCompressionLevel = 4;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[5],_cmSystemTools::cmTarCompression,_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
                      *)local_230,(char (*) [5])0x8df241,(cmTarCompression *)&minCompressionLevel);
          local_298 = TarCompressBZip2;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[6],_cmSystemTools::cmTarCompression,_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
                      *)auStack_208,(char (*) [6])"BZip2",&local_298);
          local_164[2] = 0;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[5],_cmSystemTools::cmTarCompression,_true>
                    (&local_1e0,(char (*) [5])"GZip",local_164 + 2);
          local_164[1] = 2;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[3],_cmSystemTools::cmTarCompression,_true>
                    (&local_1b8,(char (*) [3])"XZ",local_164 + 1);
          local_164[0] = TarCompressZstd;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[5],_cmSystemTools::cmTarCompression,_true>
                    (&local_190,(char (*) [5])"Zstd",local_164);
          __l._M_len = 5;
          __l._M_array = (iterator)local_230;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>_>
          ::map(&(anonymous_namespace)::
                 HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                 ::compressionTypeMap_abi_cxx11_,__l,&local_291,&local_292);
          lVar8 = -200;
          paVar9 = &local_190.first.field_2;
          do {
            if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(&paVar9->_M_allocated_capacity)[-2]) {
              operator_delete((long *)(&paVar9->_M_allocated_capacity)[-2],
                              paVar9->_M_allocated_capacity + 1);
            }
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(&paVar9->_M_allocated_capacity + -5);
            lVar8 = lVar8 + 0x28;
          } while (lVar8 != 0);
          __cxa_atexit(std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>_>
                       ::~map,&(anonymous_namespace)::
                               HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                               ::compressionTypeMap_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&(anonymous_namespace)::
                               HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                               ::compressionTypeMap_abi_cxx11_);
        }
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>_>
                ::find(&(anonymous_namespace)::
                        HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                        ::compressionTypeMap_abi_cxx11_._M_t,&parsedArgs.Compression);
        __nptr = parsedArgs.CompressionLevel._M_dataplus;
        if ((_Rb_tree_header *)iVar6._M_node ==
            &(anonymous_namespace)::
             HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
             ::compressionTypeMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
          if (parsedArgs.Compression._M_string_length != 0) {
            local_230._0_8_ = &DAT_00000011;
            local_230._8_8_ = "compression type ";
            local_230._16_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_230._24_8_ = parsedArgs.Compression._M_string_length;
            local_210 = parsedArgs.Compression._M_dataplus._M_p;
            auStack_208._0_8_ = (char *)0x0;
            auStack_208._8_8_ = 0x11;
            auStack_1f8._0_8_ = " is not supported";
            auStack_1f8._8_8_ = (void *)0x0;
            views_02._M_len = 3;
            views_02._M_array = (iterator)local_230;
            cmCatViews((string *)&minCompressionLevel,views_02);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_003cc4fe;
          }
          local_298 = 9;
          compressType = 4;
        }
        else {
          compressType = iVar6._M_node[2]._M_color;
          local_298 = 9;
          if (compressType == 3) {
            local_298 = 0x13;
          }
        }
        minCompressionLevel = 0;
        if (parsedArgs.CompressionLevel._M_string_length == 0) {
          lVar8 = 0;
LAB_003cc5da:
          if (parsedArgs.Paths.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              parsedArgs.Paths.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_230._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_230 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_230,"ARCHIVE_CREATE requires a non-empty list of PATHS","");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            local_280._M_allocated_capacity = local_230._16_8_;
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_230._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_230 + 0x10)) goto LAB_003cc22a;
            goto LAB_003cc232;
          }
          bVar2 = cmSystemTools::CreateTar
                            (&parsedArgs.Output,
                             &parsedArgs.Paths.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ,compressType,parsedArgs.Verbose,
                             &parsedArgs.MTime.
                              super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                             ,format,(int)lVar8);
          bVar1 = true;
          if (bVar2) goto LAB_003cc23e;
          cmStrCat<char_const(&)[21],std::__cxx11::string&>
                    ((string *)local_230,(char (*) [21])"failed to compress: ",&parsedArgs.Output);
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        else if ((parsedArgs.CompressionLevel._M_string_length == 1) ||
                ((int)*parsedArgs.CompressionLevel._M_dataplus._M_p - 0x30U < 10)) {
          piVar7 = __errno_location();
          local_26c = *piVar7;
          *piVar7 = 0;
          lVar8 = strtol(__nptr._M_p,(char **)local_230,10);
          if ((pointer)local_230._0_8_ == __nptr._M_p) {
            std::__throw_invalid_argument("stoi");
LAB_003cca08:
            std::__throw_out_of_range("stoi");
          }
          iVar3 = (int)lVar8;
          if ((iVar3 != lVar8) || (*piVar7 == 0x22)) goto LAB_003cca08;
          if (*piVar7 == 0) {
            *piVar7 = local_26c;
          }
          if ((iVar3 < minCompressionLevel) || ((int)local_298 < iVar3)) {
            cmStrCat<char_const(&)[19],std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[21],int&,char_const(&)[5],int&>
                      ((string *)local_230,(char (*) [19])"compression level ",
                       &parsedArgs.CompressionLevel,(char (*) [6])0x896018,&parsedArgs.Compression,
                       (char (*) [21])" should be in range ",&minCompressionLevel,
                       (char (*) [5])0x87fce3,(int *)&local_298);
            std::__cxx11::string::_M_assign((string *)&status->Error);
          }
          else {
            if (compressType != 4) goto LAB_003cc5da;
            cmStrCat<char_const(&)[58],std::__cxx11::string&>
                      ((string *)local_230,
                       (char (*) [58])"compression level is not supported for compression \"None\"",
                       &parsedArgs.Compression);
            std::__cxx11::string::_M_assign((string *)&status->Error);
          }
        }
        else {
          cmStrCat<char_const(&)[19],std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[21],int&,char_const(&)[5],int&>
                    ((string *)local_230,(char (*) [19])"compression level ",
                     &parsedArgs.CompressionLevel,(char (*) [6])0x896018,&parsedArgs.Compression,
                     (char (*) [21])" should be in range ",&minCompressionLevel,
                     (char (*) [5])0x87fce3,(int *)&local_298);
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        local_280._M_allocated_capacity = local_230._16_8_;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_230._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_230 + 0x10)) goto LAB_003cc22a;
        goto LAB_003cc232;
      }
      local_230._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0xf;
      local_230._8_8_ = "archive format ";
      local_230._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_230._24_8_ = parsedArgs.Format._M_string_length;
      local_210 = parsedArgs.Format._M_dataplus._M_p;
      auStack_208._0_8_ = (char *)0x0;
      auStack_208._8_8_ = 0x27;
      auStack_1f8._0_8_ = " does not support COMPRESSION arguments";
      auStack_1f8._8_8_ = (void *)0x0;
      views_00._M_len = 3;
      views_00._M_array = (iterator)local_230;
      cmCatViews((string *)&minCompressionLevel,views_00);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      local_230._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0xf;
      local_230._8_8_ = "archive format ";
      local_230._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_230._24_8_ = parsedArgs.Format._M_string_length;
      local_210 = parsedArgs.Format._M_dataplus._M_p;
      auStack_208._0_8_ = (char *)0x0;
      auStack_208._8_8_ = 0xe;
      auStack_1f8._0_8_ = " not supported";
      auStack_1f8._8_8_ = (void *)0x0;
      views_01._M_len = 3;
      views_01._M_array = (iterator)local_230;
      cmCatViews((string *)&minCompressionLevel,views_01);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
LAB_003cc4fe:
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)CONCAT44(uStack_28c,minCompressionLevel);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_28c,minCompressionLevel) != &local_280) goto LAB_003cc22a;
  }
  else {
    local_230._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x18;
    local_230._8_8_ = "Unrecognized argument: \"";
    local_230._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_210 = ((unrecognizedArguments.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_230._24_8_ =
         (unrecognizedArguments.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    auStack_208._0_8_ = (char *)0x0;
    auStack_208._8_8_ = 1;
    auStack_1f8._0_8_ = "\"";
    auStack_1f8._8_8_ = (void *)0x0;
    views._M_len = 3;
    views._M_array = (iterator)local_230;
    cmCatViews((string *)knownFormats,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_280._M_allocated_capacity = (size_type)knownFormats[2];
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)knownFormats[0];
    if ((char **)knownFormats[0] != knownFormats + 2) {
LAB_003cc22a:
      operator_delete(paVar9,(ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)&((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_280._M_allocated_capacity)->_M_dataplus)->
                                            _M_impl).super__Vector_impl_data._M_start + 1));
    }
  }
LAB_003cc232:
  cmSystemTools::s_FatalErrorOccurred = true;
  bVar1 = false;
LAB_003cc23e:
  HandleArchiveCreateCommand::Arguments::~Arguments(&parsedArgs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unrecognizedArguments);
  return bVar1;
}

Assistant:

bool HandleArchiveCreateCommand(std::vector<std::string> const& args,
                                cmExecutionStatus& status)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    std::string Output;
    std::string Format;
    std::string Compression;
    std::string CompressionLevel;
    // "MTIME" should require one value, but it has long been accidentally
    // accepted without one and treated as if an empty value were given.
    // Fixing this would require a policy.
    ArgumentParser::Maybe<std::string> MTime;
    bool Verbose = false;
    // "PATHS" requires at least one value, but use a custom check below.
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Paths;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("OUTPUT"_s, &Arguments::Output)
      .Bind("FORMAT"_s, &Arguments::Format)
      .Bind("COMPRESSION"_s, &Arguments::Compression)
      .Bind("COMPRESSION_LEVEL"_s, &Arguments::CompressionLevel)
      .Bind("MTIME"_s, &Arguments::MTime)
      .Bind("VERBOSE"_s, &Arguments::Verbose)
      .Bind("PATHS"_s, &Arguments::Paths);

  std::vector<std::string> unrecognizedArguments;
  auto parsedArgs =
    parser.Parse(cmMakeRange(args).advance(1), &unrecognizedArguments);
  auto argIt = unrecognizedArguments.begin();
  if (argIt != unrecognizedArguments.end()) {
    status.SetError(cmStrCat("Unrecognized argument: \"", *argIt, "\""));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.MaybeReportError(status.GetMakefile())) {
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  const char* knownFormats[] = {
    "7zip", "gnutar", "pax", "paxr", "raw", "zip"
  };

  if (!parsedArgs.Format.empty() &&
      !cm::contains(knownFormats, parsedArgs.Format)) {
    status.SetError(
      cmStrCat("archive format ", parsedArgs.Format, " not supported"));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  const char* zipFileFormats[] = { "7zip", "zip" };
  if (!parsedArgs.Compression.empty() &&
      cm::contains(zipFileFormats, parsedArgs.Format)) {
    status.SetError(cmStrCat("archive format ", parsedArgs.Format,
                             " does not support COMPRESSION arguments"));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  static std::map<std::string, cmSystemTools::cmTarCompression>
    compressionTypeMap = { { "None", cmSystemTools::TarCompressNone },
                           { "BZip2", cmSystemTools::TarCompressBZip2 },
                           { "GZip", cmSystemTools::TarCompressGZip },
                           { "XZ", cmSystemTools::TarCompressXZ },
                           { "Zstd", cmSystemTools::TarCompressZstd } };

  cmSystemTools::cmTarCompression compress = cmSystemTools::TarCompressNone;
  auto typeIt = compressionTypeMap.find(parsedArgs.Compression);
  if (typeIt != compressionTypeMap.end()) {
    compress = typeIt->second;
  } else if (!parsedArgs.Compression.empty()) {
    status.SetError(cmStrCat("compression type ", parsedArgs.Compression,
                             " is not supported"));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  int compressionLevel = 0;
  int minCompressionLevel = 0;
  int maxCompressionLevel = 9;
  if (compress == cmSystemTools::TarCompressZstd) {
    maxCompressionLevel = 19;
  }

  if (!parsedArgs.CompressionLevel.empty()) {
    if (parsedArgs.CompressionLevel.size() != 1 &&
        !std::isdigit(parsedArgs.CompressionLevel[0])) {
      status.SetError(
        cmStrCat("compression level ", parsedArgs.CompressionLevel, " for ",
                 parsedArgs.Compression, " should be in range ",
                 minCompressionLevel, " to ", maxCompressionLevel));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    compressionLevel = std::stoi(parsedArgs.CompressionLevel);
    if (compressionLevel < minCompressionLevel ||
        compressionLevel > maxCompressionLevel) {
      status.SetError(
        cmStrCat("compression level ", parsedArgs.CompressionLevel, " for ",
                 parsedArgs.Compression, " should be in range ",
                 minCompressionLevel, " to ", maxCompressionLevel));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    if (compress == cmSystemTools::TarCompressNone) {
      status.SetError(cmStrCat("compression level is not supported for "
                               "compression \"None\"",
                               parsedArgs.Compression));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  }

  if (parsedArgs.Paths.empty()) {
    status.SetError("ARCHIVE_CREATE requires a non-empty list of PATHS");
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (!cmSystemTools::CreateTar(parsedArgs.Output, parsedArgs.Paths, compress,
                                parsedArgs.Verbose, parsedArgs.MTime,
                                parsedArgs.Format, compressionLevel)) {
    status.SetError(cmStrCat("failed to compress: ", parsedArgs.Output));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  return true;
}